

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

uint32_t lzma_mf_bt4_find(lzma_mf *mf,lzma_match *matches)

{
  uint8_t *cur;
  uint32_t cur_match;
  uint8_t *puVar1;
  uint32_t *puVar2;
  bool bVar3;
  uint uVar4;
  lzma_match *plVar5;
  uint uVar6;
  uint32_t pos;
  uint len_limit;
  uint32_t uVar7;
  uint uVar8;
  ulong uVar9;
  uint32_t uVar10;
  ulong uVar11;
  uint uVar12;
  uint32_t uVar13;
  long lVar14;
  ulong uVar15;
  
  uVar4 = mf->read_pos;
  uVar6 = mf->write_pos - uVar4;
  len_limit = mf->nice_len;
  if (uVar6 < mf->nice_len) {
    if (uVar6 < 4) {
      if (mf->action == LZMA_RUN) {
        __assert_fail("mf->action != LZMA_RUN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x2a5,"uint32_t lzma_mf_bt4_find(lzma_mf *, lzma_match *)");
      }
LAB_001b7eba:
      move_pending(mf);
      return 0;
    }
    len_limit = uVar6;
    if (mf->action == LZMA_SYNC_FLUSH) goto LAB_001b7eba;
  }
  puVar1 = mf->buffer;
  puVar2 = mf->hash;
  cur = puVar1 + uVar4;
  pos = mf->offset + uVar4;
  uVar12 = (uint)puVar1[(ulong)uVar4 + 1] ^ lzma_crc32_table[0][puVar1[uVar4]];
  uVar6 = (uint)puVar1[(ulong)uVar4 + 2] << 8 ^ uVar12;
  uVar12 = uVar12 & 0x3ff;
  uVar11 = (ulong)(uVar6 & 0xffff);
  uVar13 = puVar2[uVar12];
  uVar8 = pos - uVar13;
  uVar10 = puVar2[uVar11 + 0x400];
  uVar4 = ((lzma_crc32_table[0][puVar1[(ulong)uVar4 + 3]] << 5 ^ uVar6) & mf->hash_mask) + 0x10400;
  cur_match = puVar2[uVar4];
  puVar2[uVar12] = pos;
  puVar2[uVar11 + 0x400] = pos;
  puVar2[uVar4] = pos;
  uVar4 = mf->cyclic_size;
  uVar7 = 1;
  lVar14 = 0;
  bVar3 = true;
  if ((uVar8 < uVar4) && (cur[-(ulong)uVar8] == *cur)) {
    matches->len = 2;
    matches->dist = uVar8 - 1;
    uVar7 = 2;
    lVar14 = 1;
    bVar3 = false;
  }
  if (((uVar10 == uVar13) || (uVar6 = pos - uVar10, uVar4 <= uVar6)) ||
     (uVar11 = (ulong)uVar6, cur[-uVar11] != *cur)) {
    uVar13 = 0;
    if (bVar3) {
LAB_001b7fcb:
      uVar10 = 3;
      if (3 < uVar7) {
        uVar10 = uVar7;
      }
      plVar5 = bt_find_func(len_limit,pos,cur,cur_match,mf->depth,mf->son,mf->cyclic_pos,uVar4,
                            matches + uVar13,uVar10);
      uVar13 = (uint32_t)((ulong)((long)plVar5 - (long)matches) >> 3);
      goto LAB_001b8063;
    }
    uVar11 = (ulong)uVar8;
    uVar15 = 1;
  }
  else {
    uVar15 = (ulong)((int)lVar14 + 1);
    matches[lVar14].dist = uVar6 - 1;
    uVar7 = 3;
  }
  uVar13 = (uint32_t)uVar15;
  if (len_limit < uVar7) {
    __assert_fail("len <= limit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                  ,0x2e,
                  "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)");
  }
  if ((int)len_limit < 0) {
    __assert_fail("limit <= UINT32_MAX / 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                  ,0x2f,
                  "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)");
  }
  if (uVar7 < len_limit) {
LAB_001b802d:
    uVar9 = *(long *)(cur + uVar7) - *(long *)(cur + (uVar7 - uVar11));
    if (uVar9 == 0) goto code_r0x001b803a;
    uVar11 = 0;
    if (uVar9 != 0) {
      for (; (uVar9 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    uVar6 = ((uint)(uVar11 >> 3) & 0x1fffffff) + uVar7;
    uVar7 = uVar6;
    if (uVar6 >= len_limit) {
      uVar7 = len_limit;
    }
    matches[uVar15 - 1].len = uVar7;
    if (uVar6 < len_limit) goto LAB_001b7fcb;
    goto LAB_001b804b;
  }
LAB_001b8043:
  matches[uVar15 - 1].len = len_limit;
LAB_001b804b:
  bt_skip_func(len_limit,pos,cur,cur_match,mf->depth,mf->son,mf->cyclic_pos,uVar4);
LAB_001b8063:
  move_pos(mf);
  return uVar13;
code_r0x001b803a:
  uVar7 = uVar7 + 8;
  if (len_limit <= uVar7) goto LAB_001b8043;
  goto LAB_001b802d;
}

Assistant:

extern uint32_t
lzma_mf_bt4_find(lzma_mf *mf, lzma_match *matches)
{
	header_find(true, 4);

	hash_4_calc();

	uint32_t delta2 = pos - mf->hash[hash_2_value];
	const uint32_t delta3
			= pos - mf->hash[FIX_3_HASH_SIZE + hash_3_value];
	const uint32_t cur_match = mf->hash[FIX_4_HASH_SIZE + hash_value];

	mf->hash[hash_2_value] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_3_value] = pos;
	mf->hash[FIX_4_HASH_SIZE + hash_value] = pos;

	uint32_t len_best = 1;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		len_best = 2;
		matches[0].len = 2;
		matches[0].dist = delta2 - 1;
		matches_count = 1;
	}

	if (delta2 != delta3 && delta3 < mf->cyclic_size
			&& *(cur - delta3) == *cur) {
		len_best = 3;
		matches[matches_count++].dist = delta3 - 1;
		delta2 = delta3;
	}

	if (matches_count != 0) {
		len_best = lzma_memcmplen(
				cur, cur - delta2, len_best, len_limit);

		matches[matches_count - 1].len = len_best;

		if (len_best == len_limit) {
			bt_skip();
			return matches_count;
		}
	}

	if (len_best < 3)
		len_best = 3;

	bt_find(len_best);
}